

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O1

bool tao::pegtl::internal::istring<(char)69,(char)110,(char)100,(char)58>::
     match<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>>
               (file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)(in->
                   super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
                   super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                   .
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                   .m_current.data;
  if ((((3 < (ulong)((long)(in->
                           super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>
                           ).
                           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                           .
                           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                           .m_end - (long)pbVar3)) && ((*pbVar3 & 0xdf) == 0x45)) &&
      ((pbVar3[1] & 0xdf) == 0x4e)) && (((pbVar3[2] & 0xdf) == 0x44 && (pbVar3[3] == 0x3a)))) {
    piVar1 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current;
    piVar1->data = piVar1->data + 4;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte;
    *psVar2 = *psVar2 + 4;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte_in_line;
    *psVar2 = *psVar2 + 4;
    return true;
  }
  return false;
}

Assistant:

const char* current() const noexcept
            {
               return m_current.data;
            }